

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

void DiscardPriorPreloaded(CP_Services Svcs,Evpath_RS_Stream RS_Stream,size_t Timestep)

{
  ulong *puVar1;
  code *pcVar2;
  undefined8 uVar3;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  uint64_t uVar7;
  ulong in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  CManager cm;
  RSTimestepList ItemToFree;
  RSTimestepList Next;
  RSTimestepList Last;
  RSTimestepList Entry;
  ulong *local_28;
  ulong *local_20;
  
  local_28 = (ulong *)0x0;
  local_20 = *(ulong **)(in_RSI + 0x60);
  while (local_20 != (ulong *)0x0) {
    puVar1 = (ulong *)local_20[5];
    if (*local_20 < in_RDX) {
      uVar6 = (*(code *)in_RDI[1])(*(undefined8 *)(in_RSI + 8));
      if (local_28 == (ulong *)0x0) {
        *(ulong *)(in_RSI + 0x60) = local_20[5];
      }
      else {
        local_28[5] = local_20[5];
      }
      if (local_20[2] != 0) {
        pcVar2 = (code *)*in_RDI;
        uVar3 = *(undefined8 *)(in_RSI + 8);
        uVar4 = *local_20;
        uVar5 = local_20[2];
        uVar7 = writeBlockFingerprint((char *)local_20[2],local_20[3]);
        (*pcVar2)(uVar3,4,"Discarding prior, TS %ld, data %p, fprint %lx\n",uVar4,uVar5,uVar7);
        CMreturn_buffer(uVar6,local_20[2]);
      }
      free(local_20);
      local_20 = puVar1;
    }
    else {
      local_28 = local_20;
      local_20 = puVar1;
    }
  }
  return;
}

Assistant:

static void DiscardPriorPreloaded(CP_Services Svcs, Evpath_RS_Stream RS_Stream, size_t Timestep)
{
    RSTimestepList Entry, Last = NULL;
    Entry = RS_Stream->QueuedTimesteps;

    while (Entry)
    {
        RSTimestepList Next = Entry->Next;
        if (Entry->Timestep < Timestep)
        {
            RSTimestepList ItemToFree = Entry;
            CManager cm = Svcs->getCManager(RS_Stream->CP_Stream);
            if (Last)
            {
                Last->Next = Entry->Next;
            }
            else
            {
                RS_Stream->QueuedTimesteps = Entry->Next;
            }
            /* free item */
            if (ItemToFree->Data)
            {
                Svcs->verbose(RS_Stream->CP_Stream, DPPerRankVerbose,
                              "Discarding prior, TS %ld, data %p, fprint %lx\n",
                              ItemToFree->Timestep, ItemToFree->Data,
                              writeBlockFingerprint(ItemToFree->Data, ItemToFree->DataSize));
                CMreturn_buffer(cm, ItemToFree->Data);
            }

            free(ItemToFree);
        }
        else
        {
            Last = Entry;
        }
        Entry = Next;
    }
}